

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

Edge * __thiscall Graph::addEdge(Graph *this,int from,int to,Edge *edge)

{
  pointer pvVar1;
  pointer ppEVar2;
  Edge *pEVar3;
  _Insert_base<const_Edge_*,_const_Edge_*,_std::allocator<const_Edge_*>,_std::__detail::_Identity,_std::equal_to<const_Edge_*>,_std::hash<const_Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  pointer ppEVar4;
  Edge *local_40;
  key_type local_38;
  
  pvVar1 = (this->adjList).
           super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = *(pointer *)
             ((long)&pvVar1[from].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8);
  local_40 = edge;
  for (ppEVar4 = *(pointer *)
                  &pvVar1[from].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl;
      ppEVar4 != ppEVar2; ppEVar4 = ppEVar4 + 1) {
    pEVar3 = Edge::addNeighbour(edge,*ppEVar4);
    Edge::addNeighbour(pEVar3,edge);
  }
  pvVar1 = (this->adjList).
           super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = *(pointer *)
             ((long)&pvVar1[to].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8);
  for (ppEVar4 = *(pointer *)&pvVar1[to].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl
      ; ppEVar4 != ppEVar2; ppEVar4 = ppEVar4 + 1) {
    pEVar3 = Edge::addNeighbour(edge,*ppEVar4);
    Edge::addNeighbour(pEVar3,edge);
  }
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
            ((this->adjList).
             super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + from,&local_40);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
            ((this->adjList).
             super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + to,&local_40);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(&this->edges,&local_40);
  local_38 = (key_type)local_40->ttd;
  this_00 = (_Insert_base<const_Edge_*,_const_Edge_*,_std::allocator<const_Edge_*>,_std::__detail::_Identity,_std::equal_to<const_Edge_*>,_std::hash<const_Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->ttds,&local_38);
  std::__detail::
  _Insert_base<const_Edge_*,_const_Edge_*,_std::allocator<const_Edge_*>,_std::__detail::_Identity,_std::equal_to<const_Edge_*>,_std::hash<const_Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert(this_00,&local_40);
  return (*(pointer *)
           ((long)&(this->adjList).
                   super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[from].
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8))[-1];
}

Assistant:

const Edge& Graph::addEdge(int from, int to, Edge* edge) {
  for(Edge* neighbour: adjList[from]) {
    edge->addNeighbour(neighbour)->addNeighbour(edge);
  }
  for(Edge* neighbour: adjList[to]) {
    edge->addNeighbour(neighbour)->addNeighbour(edge);
  }
  adjList[from].push_back(edge);
  adjList[to].push_back(edge);
  edges.push_back(edge);
  ttds[edge->ttd].insert(edge);
  return *adjList[from].back();
}